

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O1

void * memRealloc(void *buf,size_t count)

{
  void *pvVar1;
  
  if (count == 0) {
    free(buf);
    return (void *)0x0;
  }
  pvVar1 = realloc(buf,count);
  return pvVar1;
}

Assistant:

void* memRealloc(void* buf, size_t count)
{
	if (count == 0)
	{
		memFree(buf);
		return 0;
	}
#ifdef OS_WIN
	if (!buf)
		return HeapAlloc(GetProcessHeap(), 0, count);
	return HeapReAlloc(GetProcessHeap(), 0, buf, count);
#else
	return realloc(buf, count);
#endif
}